

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O0

QVariant * __thiscall
QSettingsPrivate::value(QSettingsPrivate *this,QAnyStringView key,QVariant *defaultValue)

{
  QAnyStringView key_00;
  bool bVar1;
  size_t in_RDX;
  long *in_RSI;
  QSettingsPrivate *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  optional<QVariant> r;
  QVariant *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  int line;
  QVariant *this_00;
  QSettingsPrivate *this_01;
  QSettingsPrivate *this_02;
  QVariant local_80;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_ffffffffffffffb0;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_02 = in_RDI;
  bVar1 = QAnyStringView::isEmpty((QAnyStringView *)0x7b392f);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_01,(char *)in_RDI,line,(char *)in_stack_ffffffffffffff18);
    QMessageLogger::warning
              ((QMessageLogger *)&local_80.d.field_0x18,"QSettings::value: Empty key passed");
    ::QVariant::QVariant((QVariant *)0x7b396b);
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    this_00 = &local_80;
    key_00.m_size = in_RDX;
    key_00.field_0.m_data = in_stack_ffffffffffffffb0.m_data;
    actualKey(this_02,key_00);
    (**(code **)(*in_RSI + 0x30))(&local_38,in_RSI,this_00);
    QString::~QString((QString *)0x7b39eb);
    bVar1 = std::optional::operator_cast_to_bool((optional<QVariant> *)0x7b39f8);
    if (bVar1) {
      std::optional<QVariant>::operator*((optional<QVariant> *)0x7b3a0b);
      ::QVariant::QVariant(in_stack_ffffffffffffff18,(QVariant *)0x7b3a18);
    }
    std::optional<QVariant>::~optional((optional<QVariant> *)0x7b3a55);
    if (!bVar1) {
      if (in_R8 == 0) {
        ::QVariant::QVariant((QVariant *)0x7b3a84);
      }
      else {
        ::QVariant::QVariant(this_00,in_stack_ffffffffffffff18);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QVariant *)this_01;
}

Assistant:

QVariant QSettingsPrivate::value(QAnyStringView key, const QVariant *defaultValue) const
{
    if (key.isEmpty()) {
        qWarning("QSettings::value: Empty key passed");
        return QVariant();
    }
    if (std::optional r = get(actualKey(key)))
        return std::move(*r);
    if (defaultValue)
        return *defaultValue;
    return QVariant();
}